

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O0

void presolve::dev_kkt_check::checkPrimalFeasMatrix(State *state,KktConditionDetails *details)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  ostream *poVar4;
  void *pvVar5;
  undefined4 *in_RSI;
  long in_RDI;
  double infeas;
  double rowV;
  int i;
  double local_28;
  int local_14;
  
  *in_RSI = 1;
  in_RSI[6] = 0;
  in_RSI[7] = 0;
  *(undefined8 *)(in_RSI + 2) = 0;
  *(undefined8 *)(in_RSI + 4) = 0;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 4); local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x70),(long)local_14);
    if (*pvVar2 != 0) {
      in_RSI[6] = in_RSI[6] + 1;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x88),
                          (long)local_14);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x58),
                          (long)local_14);
      if ((dVar1 <= *pvVar3) ||
         (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x60),
                              (long)local_14), *pvVar3 <= dVar1)) {
        local_28 = 0.0;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x58),
                            (long)local_14);
        if ((dVar1 - *pvVar3 < 0.0) &&
           (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x58),
                                (long)local_14), 1e-07 < ABS(dVar1 - *pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x58),
                              (long)local_14);
          local_28 = *pvVar3 - dVar1;
          poVar4 = std::operator<<((ostream *)&std::cout,"Row ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
          poVar4 = std::operator<<(poVar4," infeasible: Row value=");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
          poVar4 = std::operator<<(poVar4,"  L=");
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x58),
                              (long)local_14);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
          poVar4 = std::operator<<(poVar4,"  U=");
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x60),
                              (long)local_14);
          pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar3);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x60),
                            (long)local_14);
        if ((0.0 < dVar1 - *pvVar3) &&
           (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x60),
                                (long)local_14), 1e-07 < ABS(dVar1 - *pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x60),
                              (long)local_14);
          local_28 = dVar1 - *pvVar3;
          poVar4 = std::operator<<((ostream *)&std::cout,"Row ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
          poVar4 = std::operator<<(poVar4," infeasible: Row value=");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
          poVar4 = std::operator<<(poVar4,"  L=");
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x58),
                              (long)local_14);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
          poVar4 = std::operator<<(poVar4,"  U=");
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x60),
                              (long)local_14);
          pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar3);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
        if (0.0 < local_28) {
          in_RSI[7] = in_RSI[7] + 1;
          *(double *)(in_RSI + 4) = local_28 * local_28 + *(double *)(in_RSI + 4);
          if (*(double *)(in_RSI + 2) < local_28) {
            *(double *)(in_RSI + 2) = local_28;
          }
        }
      }
    }
  }
  if (in_RSI[7] == 0) {
    std::operator<<((ostream *)&std::cout,"Primal feasible.\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"KKT check error: Primal infeasible.\n");
  }
  return;
}

Assistant:

void checkPrimalFeasMatrix(const State& state, KktConditionDetails& details) {
  details.type = KktCondition::kPrimalFeasibility;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;
      double rowV = state.rowValue[i];

      if (state.rowLower[i] < rowV && rowV < state.rowUpper[i]) continue;
      double infeas = 0;

      if (((rowV - state.rowLower[i]) < 0) &&
          (fabs(rowV - state.rowLower[i]) > tol)) {
        infeas = state.rowLower[i] - rowV;
        if (dev_print == 1)
          std::cout << "Row " << i << " infeasible: Row value=" << rowV
                    << "  L=" << state.rowLower[i]
                    << "  U=" << state.rowUpper[i] << std::endl;
      }

      if (((rowV - state.rowUpper[i]) > 0) &&
          (fabs(rowV - state.rowUpper[i]) > tol)) {
        infeas = rowV - state.rowUpper[i];
        if (dev_print == 1)
          std::cout << "Row " << i << " infeasible: Row value=" << rowV
                    << "  L=" << state.rowLower[i]
                    << "  U=" << state.rowUpper[i] << std::endl;
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Primal feasible.\n";
  } else {
    if (dev_print == 1) std::cout << "KKT check error: Primal infeasible.\n";
  }
}